

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmLink<(moira::Instr)68,(moira::Mode)12,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  Ims<4> im;
  StrWriter *pSVar2;
  Av<(moira::Instr)68,_(moira::Mode)12,_4> local_2c;
  
  im.raw = dasmIncRead<4>(this,addr);
  SVar1 = str->style->syntax;
  pSVar2 = StrWriter::operator<<(str);
  if ((SVar1 & ~MOIRA_MIT) == GNU) {
    pSVar2 = StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
    StrWriter::operator<<(pSVar2,(An)(op & 7));
    StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2,im);
    return;
  }
  StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar2,(An)(op & 7));
  StrWriter::operator<<(pSVar2);
  pSVar2 = StrWriter::operator<<(pSVar2,im);
  local_2c.ext1 = 0;
  StrWriter::operator<<(pSVar2,&local_2c);
  return;
}

Assistant:

void
Moira::dasmLink(StrWriter &str, u32 &addr, u16 op) const
{
    auto dsp = dasmIncRead<S>(addr);
    auto src = An ( _____________xxx(op) );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << Ims<S>(dsp);
            break;

        default:

            str << Ins<I>{} << str.tab << src << Sep{} << Ims<S>(dsp) << Av<I, M, S>{};
    }
}